

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteCnf.c
# Opt level: O0

int Io_WriteCnf(Abc_Ntk_t *pNtk,char *pFileName,int fAllPrimes)

{
  int iVar1;
  sat_solver *p;
  sat_solver *pSat;
  int fAllPrimes_local;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    printf("Io_WriteCnf() warning: Generating CNF by convering logic nodes into CNF clauses.\n");
  }
  else {
    printf("Io_WriteCnf() warning: Generating CNF by applying heuristic AIG to CNF conversion.\n");
  }
  iVar1 = Abc_NtkPoNum(pNtk);
  if (iVar1 == 1) {
    iVar1 = Abc_NtkLatchNum(pNtk);
    if (iVar1 == 0) {
      iVar1 = Abc_NtkNodeNum(pNtk);
      if (iVar1 == 0) {
        fprintf(_stdout,"The network has no logic nodes. No CNF file is generaled.\n");
        pNtk_local._4_4_ = 0;
      }
      else {
        iVar1 = Abc_NtkIsLogic(pNtk);
        if (iVar1 != 0) {
          Abc_NtkToBdd(pNtk);
        }
        p = (sat_solver *)Abc_NtkMiterSatCreate(pNtk,fAllPrimes);
        if (p == (sat_solver *)0x0) {
          fprintf(_stdout,"The problem is trivially UNSAT. No CNF file is generated.\n");
          pNtk_local._4_4_ = 1;
        }
        else {
          s_pNtk = pNtk;
          Sat_SolverWriteDimacs(p,pFileName,(lit *)0x0,(lit *)0x0,1);
          s_pNtk = (Abc_Ntk_t *)0x0;
          sat_solver_delete(p);
          pNtk_local._4_4_ = 1;
        }
      }
    }
    else {
      fprintf(_stdout,
              "Io_WriteCnf(): Currently can only process the miter for combinational circuits.\n");
      pNtk_local._4_4_ = 0;
    }
  }
  else {
    fprintf(_stdout,
            "Io_WriteCnf(): Currently can only process the miter (the network with one PO).\n");
    pNtk_local._4_4_ = 0;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Io_WriteCnf( Abc_Ntk_t * pNtk, char * pFileName, int fAllPrimes )
{
    sat_solver * pSat;
    if ( Abc_NtkIsStrash(pNtk) )
        printf( "Io_WriteCnf() warning: Generating CNF by applying heuristic AIG to CNF conversion.\n" );
    else
        printf( "Io_WriteCnf() warning: Generating CNF by convering logic nodes into CNF clauses.\n" );
    if ( Abc_NtkPoNum(pNtk) != 1 )
    {
        fprintf( stdout, "Io_WriteCnf(): Currently can only process the miter (the network with one PO).\n" );
        return 0;
    }
    if ( Abc_NtkLatchNum(pNtk) != 0 )
    {
        fprintf( stdout, "Io_WriteCnf(): Currently can only process the miter for combinational circuits.\n" );
        return 0;
    }
    if ( Abc_NtkNodeNum(pNtk) == 0 )
    {
        fprintf( stdout, "The network has no logic nodes. No CNF file is generaled.\n" );
        return 0;
    }
    // convert to logic BDD network
    if ( Abc_NtkIsLogic(pNtk) )
        Abc_NtkToBdd( pNtk );
    // create solver with clauses
    pSat = (sat_solver *)Abc_NtkMiterSatCreate( pNtk, fAllPrimes );
    if ( pSat == NULL )
    {
        fprintf( stdout, "The problem is trivially UNSAT. No CNF file is generated.\n" );
        return 1;
    }        
    // write the clauses
    s_pNtk = pNtk;
    Sat_SolverWriteDimacs( pSat, pFileName, 0, 0, 1 );
    s_pNtk = NULL;
    // free the solver
    sat_solver_delete( pSat );
    return 1;
}